

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

Bool tidyOptSetInt(TidyDoc tdoc,TidyOptionId optId,ulong val)

{
  TidyDocImpl *impl;
  ulong val_local;
  TidyOptionId optId_local;
  TidyDoc tdoc_local;
  
  if (tdoc == (TidyDoc)0x0) {
    tdoc_local._4_4_ = no;
  }
  else if (optId == TidyDoctype) {
    tdoc_local._4_4_ = prvTidySetOptionInt((TidyDocImpl *)tdoc,TidyDoctypeMode,val);
  }
  else {
    tdoc_local._4_4_ = prvTidySetOptionInt((TidyDocImpl *)tdoc,optId,val);
  }
  return tdoc_local._4_4_;
}

Assistant:

Bool TIDY_CALL        tidyOptSetInt( TidyDoc tdoc, TidyOptionId optId, ulong val )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    if ( impl )
    {
        /* Special case for TidyDoctype, because it has a picklist */
        if ( optId == TidyDoctype )
            return TY_(SetOptionInt)( impl, TidyDoctypeMode, val );
        else
            return TY_(SetOptionInt)( impl, optId, val );
    }
    return no;
}